

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcBezierCurve::IfcBezierCurve(IfcBezierCurve *this,void **vtt)

{
  void *pvVar1;
  
  IfcBSplineCurve::IfcBSplineCurve(&this->super_IfcBSplineCurve,vtt + 1);
  pvVar1 = vtt[0x1f];
  *(void **)&(this->super_IfcBSplineCurve).field_0xb0 = pvVar1;
  *(void **)(&(this->super_IfcBSplineCurve).field_0xb0 + *(long *)((long)pvVar1 + -0x18)) =
       vtt[0x20];
  pvVar1 = *vtt;
  (this->super_IfcBSplineCurve).super_IfcBoundedCurve.super_IfcCurve.
  super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)pvVar1;
  *(void **)((long)&(this->super_IfcBSplineCurve).super_IfcBoundedCurve.super_IfcCurve.
                    super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
                    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                    _vptr_ObjectHelper + *(long *)((long)pvVar1 + -0x18)) = vtt[0x21];
  *(void **)&(this->super_IfcBSplineCurve).super_IfcBoundedCurve.super_IfcCurve.
             super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 =
       vtt[0x22];
  *(void **)&(this->super_IfcBSplineCurve).super_IfcBoundedCurve.super_IfcCurve.
             super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 =
       vtt[0x23];
  *(void **)&(this->super_IfcBSplineCurve).super_IfcBoundedCurve.super_IfcCurve.
             super_IfcGeometricRepresentationItem.field_0x30 = vtt[0x24];
  *(void **)&(this->super_IfcBSplineCurve).super_IfcBoundedCurve.super_IfcCurve.field_0x40 =
       vtt[0x25];
  *(void **)&(this->super_IfcBSplineCurve).field_0xb0 = vtt[0x26];
  return;
}

Assistant:

IfcBezierCurve() : Object("IfcBezierCurve") {}